

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode Curl_pop3_write(connectdata *conn,char *str,size_t nread)

{
  char cVar1;
  Curl_easy *pCVar2;
  long lVar3;
  bool bVar4;
  CURLcode CVar5;
  bool bVar6;
  char **local_80;
  char **local_68;
  size_t prev;
  size_t i;
  size_t last;
  _Bool strip_dot;
  pop3_conn *pop3c;
  SingleRequest *k;
  Curl_easy *data;
  CURLcode result;
  size_t nread_local;
  char *str_local;
  connectdata *conn_local;
  
  pCVar2 = conn->data;
  bVar4 = false;
  i = 0;
  prev = 0;
  do {
    data._4_4_ = CURLE_OK;
    if (nread <= prev) {
      if ((conn->proto).ftpc.dirs == (char **)0x5) {
        conn_local._4_4_ = Curl_client_write(conn,1,"\r\n.\r\n",2);
        (pCVar2->req).keepon = (pCVar2->req).keepon & 0xfffffffe;
        (conn->proto).ftpc.dirs = (char **)0x0;
      }
      else if ((conn->proto).ftpc.dirs == (char **)0x0) {
        if (nread != i) {
          data._4_4_ = Curl_client_write(conn,1,str + i,nread - i);
        }
        conn_local._4_4_ = data._4_4_;
      }
      else {
        conn_local._4_4_ = CURLE_OK;
      }
      return conn_local._4_4_;
    }
    local_68 = (char **)(conn->proto).pop3c.eob;
    cVar1 = str[prev];
    if (cVar1 == '\n') {
      if (((conn->proto).ftpc.dirs == (char **)0x1) || ((conn->proto).ftpc.dirs == (char **)0x4)) {
        (conn->proto).ftpc.dirs = (char **)((long)&((conn->proto).imapc.sasl.params)->service + 1);
      }
      else {
        (conn->proto).ftpc.dirs = (char **)0x0;
      }
    }
    else if (cVar1 == '\r') {
      if ((conn->proto).ftpc.dirs == (char **)0x0) {
        (conn->proto).ftpc.dirs = (char **)((long)&((conn->proto).imapc.sasl.params)->service + 1);
        if (prev != 0) {
          CVar5 = Curl_client_write(conn,1,str + i,prev - i);
          if (CVar5 != CURLE_OK) {
            return CVar5;
          }
          i = prev;
        }
      }
      else if ((conn->proto).ftpc.dirs == (char **)0x3) {
        (conn->proto).ftpc.dirs = (char **)((long)&((conn->proto).imapc.sasl.params)->service + 1);
      }
      else {
        (conn->proto).pop3c.eob = 1;
      }
    }
    else if (cVar1 == '.') {
      if ((conn->proto).ftpc.dirs == (char **)0x2) {
        (conn->proto).ftpc.dirs = (char **)((long)&((conn->proto).imapc.sasl.params)->service + 1);
      }
      else if ((conn->proto).ftpc.dirs == (char **)0x3) {
        bVar4 = true;
        (conn->proto).ftpc.dirs = (char **)0x0;
      }
      else {
        (conn->proto).ftpc.dirs = (char **)0x0;
      }
    }
    else {
      (conn->proto).ftpc.dirs = (char **)0x0;
    }
    if ((local_68 != (char **)0x0) && ((conn->proto).ftpc.dirs <= local_68)) {
      while( true ) {
        bVar6 = false;
        if (local_68 != (char **)0x0) {
          lVar3._0_4_ = *(saslstate *)((long)&conn->proto + 0x80);
          lVar3._4_4_ = *(uint *)((long)&conn->proto + 0x84);
          bVar6 = lVar3 != 0;
        }
        if (!bVar6) break;
        local_68 = (char **)((long)local_68 - 1);
        *(size_t *)&(conn->proto).imapc.sasl.state = (conn->proto).pop3c.strip - 1;
      }
      if (local_68 != (char **)0x0) {
        if (bVar4) {
          local_80 = (char **)((long)local_68 - 1);
        }
        else {
          local_80 = local_68;
        }
        CVar5 = Curl_client_write(conn,1,"\r\n.\r\n",(size_t)local_80);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
        i = prev;
        bVar4 = false;
      }
    }
    prev = prev + 1;
  } while( true );
}

Assistant:

CURLcode Curl_pop3_write(struct connectdata *conn, char *str, size_t nread)
{
  /* This code could be made into a special function in the handler struct */
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;

  struct pop3_conn *pop3c = &conn->proto.pop3c;
  bool strip_dot = FALSE;
  size_t last = 0;
  size_t i;

  /* Search through the buffer looking for the end-of-body marker which is
     5 bytes (0d 0a 2e 0d 0a). Note that a line starting with a dot matches
     the eob so the server will have prefixed it with an extra dot which we
     need to strip out. Additionally the marker could of course be spread out
     over 5 different data chunks. */
  for(i = 0; i < nread; i++) {
    size_t prev = pop3c->eob;

    switch(str[i]) {
    case 0x0d:
      if(pop3c->eob == 0) {
        pop3c->eob++;

        if(i) {
          /* Write out the body part that didn't match */
          result = Curl_client_write(conn, CLIENTWRITE_BODY, &str[last],
                                     i - last);

          if(result)
            return result;

          last = i;
        }
      }
      else if(pop3c->eob == 3)
        pop3c->eob++;
      else
        /* If the character match wasn't at position 0 or 3 then restart the
           pattern matching */
        pop3c->eob = 1;
      break;

    case 0x0a:
      if(pop3c->eob == 1 || pop3c->eob == 4)
        pop3c->eob++;
      else
        /* If the character match wasn't at position 1 or 4 then start the
           search again */
        pop3c->eob = 0;
      break;

    case 0x2e:
      if(pop3c->eob == 2)
        pop3c->eob++;
      else if(pop3c->eob == 3) {
        /* We have an extra dot after the CRLF which we need to strip off */
        strip_dot = TRUE;
        pop3c->eob = 0;
      }
      else
        /* If the character match wasn't at position 2 then start the search
           again */
        pop3c->eob = 0;
      break;

    default:
      pop3c->eob = 0;
      break;
    }

    /* Did we have a partial match which has subsequently failed? */
    if(prev && prev >= pop3c->eob) {
      /* Strip can only be non-zero for the very first mismatch after CRLF
         and then both prev and strip are equal and nothing will be output
         below */
      while(prev && pop3c->strip) {
        prev--;
        pop3c->strip--;
      }

      if(prev) {
        /* If the partial match was the CRLF and dot then only write the CRLF
           as the server would have inserted the dot */
        result = Curl_client_write(conn, CLIENTWRITE_BODY, (char *)POP3_EOB,
                                   strip_dot ? prev - 1 : prev);

        if(result)
          return result;

        last = i;
        strip_dot = FALSE;
      }
    }
  }

  if(pop3c->eob == POP3_EOB_LEN) {
    /* We have a full match so the transfer is done, however we must transfer
    the CRLF at the start of the EOB as this is considered to be part of the
    message as per RFC-1939, sect. 3 */
    result = Curl_client_write(conn, CLIENTWRITE_BODY, (char *)POP3_EOB, 2);

    k->keepon &= ~KEEP_RECV;
    pop3c->eob = 0;

    return result;
  }

  if(pop3c->eob)
    /* While EOB is matching nothing should be output */
    return CURLE_OK;

  if(nread - last) {
    result = Curl_client_write(conn, CLIENTWRITE_BODY, &str[last],
                               nread - last);
  }

  return result;
}